

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::SampleDepthCase::init(SampleDepthCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLenum GVar3;
  int iVar4;
  RenderTarget *pRVar5;
  NotSupportedError *this_00;
  MessageBuilder local_190;
  
  pTVar2 = ((this->super_NumSamplesCase).super_MultisampleCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  pRVar5 = Context::getRenderTarget
                     ((this->super_NumSamplesCase).super_MultisampleCase.super_TestCase.m_context);
  if (pRVar5->m_depthBits != 0) {
    MultisampleCase::init((MultisampleCase *)this,ctx);
    glwEnable(0xb71);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glEnable(GL_DEPTH_TEST)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x38d);
    glwDepthFunc(0x201);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glDepthFunc(GL_LESS)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x38e);
    poVar1 = &local_190.m_str;
    local_190.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Depth test enabled, depth func is GL_LESS");
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    poVar1 = &local_190.m_str;
    local_190.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Drawing several bigger-than-viewport black or white polygons intersecting each other"
                   );
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    iVar4 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    return iVar4;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Test requires depth buffer",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
             ,0x389);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SampleDepthCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	if (m_context.getRenderTarget().getDepthBits() == 0)
		TCU_THROW(NotSupportedError, "Test requires depth buffer");

	MultisampleCase::init();

	GLU_CHECK_CALL(glEnable(GL_DEPTH_TEST));
	GLU_CHECK_CALL(glDepthFunc(GL_LESS));

	log << TestLog::Message << "Depth test enabled, depth func is GL_LESS" << TestLog::EndMessage;
	log << TestLog::Message << "Drawing several bigger-than-viewport black or white polygons intersecting each other" << TestLog::EndMessage;
}